

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_field_sample_generated.h
# Opt level: O0

void __thiscall
keyfield::sample::Grain::Grain(Grain *this,span<const_keyfield::sample::Rice,_3UL> *_a,uint8_t _tag)

{
  uchar uVar1;
  Array<keyfield::sample::Rice,_(unsigned_short)3> *this_00;
  Grain *local_38;
  span<const_keyfield::sample::Rice,_3UL> local_30;
  uint8_t local_19;
  span<const_keyfield::sample::Rice,_3UL> *psStack_18;
  uint8_t _tag_local;
  span<const_keyfield::sample::Rice,_3UL> *_a_local;
  Grain *this_local;
  
  local_38 = this;
  local_19 = _tag;
  psStack_18 = _a;
  _a_local = (span<const_keyfield::sample::Rice,_3UL> *)this;
  do {
    Rice::Rice(local_38->a_);
    local_38 = (Grain *)(local_38->a_ + 1);
  } while (local_38 != (Grain *)&this->tag_);
  uVar1 = flatbuffers::EndianScalar<unsigned_char>(local_19);
  this->tag_ = uVar1;
  this->padding0__ = '\0';
  this->padding1__ = 0;
  this_00 = flatbuffers::CastToArray<keyfield::sample::Rice,(unsigned_short)3>(this->a_);
  flatbuffers::span<const_keyfield::sample::Rice,_3UL>::span(&local_30,_a);
  flatbuffers::Array<keyfield::sample::Rice,_(unsigned_short)3>::CopyFromSpan(this_00,&local_30);
  return;
}

Assistant:

Grain(::flatbuffers::span<const keyfield::sample::Rice, 3> _a, uint8_t _tag)
      : tag_(::flatbuffers::EndianScalar(_tag)),
        padding0__(0),
        padding1__(0) {
    ::flatbuffers::CastToArray(a_).CopyFromSpan(_a);
    (void)padding0__;
    (void)padding1__;
  }